

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::addProperty(SimInfo *this,shared_ptr<OpenMD::GenericData> *genData)

{
  shared_ptr<OpenMD::GenericData> local_18;
  
  local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  PropertyMap::addProperty(&this->properties_,&local_18);
  if (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void SimInfo::addProperty(std::shared_ptr<GenericData> genData) {
    properties_.addProperty(genData);
  }